

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

void __thiscall
el::base::debug::StackTrace::StackTraceEntry::~StackTraceEntry(StackTraceEntry *this)

{
  std::__cxx11::string::~string((string *)&this->m_addr);
  std::__cxx11::string::~string((string *)&this->m_hex);
  std::__cxx11::string::~string((string *)&this->m_demangled);
  std::__cxx11::string::~string((string *)&this->m_location);
  return;
}

Assistant:

StackTraceEntry(std::size_t index, char* loc) :
      m_index(index),
      m_location(loc) {
    }